

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void ra_append_copy(roaring_array_t *ra,roaring_array_t *sa,uint16_t index,_Bool copy_on_write)

{
  int iVar1;
  uint8_t *puVar2;
  undefined8 *c;
  container_t *pcVar3;
  undefined8 *puVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  undefined6 in_register_00000012;
  ulong uVar6;
  
  uVar6 = CONCAT62(in_register_00000012,index) & 0xffffffff;
  extend_array(ra,1);
  iVar1 = ra->size;
  ra->keys[iVar1] = sa->keys[uVar6];
  puVar2 = sa->typecodes;
  c = (undefined8 *)sa->containers[uVar6];
  if ((int)CONCAT71(in_register_00000009,copy_on_write) == 0) {
    pcVar3 = container_clone(c,puVar2[uVar6]);
  }
  else {
    if (puVar2[uVar6] == '\x04') {
      LOCK();
      *(int *)((long)c + 0xc) = *(int *)((long)c + 0xc) + 1;
      UNLOCK();
      puVar4 = c;
    }
    else {
      puVar4 = (undefined8 *)(*global_memory_hook.malloc)(0x10);
      if (puVar4 == (undefined8 *)0x0) {
        puVar4 = (undefined8 *)0x0;
      }
      else {
        *puVar4 = c;
        *(uint8_t *)(puVar4 + 1) = puVar2[uVar6];
        LOCK();
        *(undefined4 *)((long)puVar4 + 0xc) = 2;
        UNLOCK();
        puVar2[uVar6] = '\x04';
      }
    }
    uVar5 = (ulong)(uint)((int)CONCAT62(in_register_00000012,index) * 8);
    *(undefined8 **)((long)sa->containers + uVar5) = puVar4;
    pcVar3 = *(container_t **)((long)sa->containers + uVar5);
  }
  ra->containers[iVar1] = pcVar3;
  ra->typecodes[iVar1] = sa->typecodes[uVar6];
  ra->size = ra->size + 1;
  return;
}

Assistant:

void ra_append_copy(roaring_array_t *ra, const roaring_array_t *sa,
                    uint16_t index, bool copy_on_write) {
    extend_array(ra, 1);
    const int32_t pos = ra->size;

    // old contents is junk that does not need freeing
    ra->keys[pos] = sa->keys[index];
    // the shared container will be in two bitmaps
    if (copy_on_write) {
        sa->containers[index] = get_copy_of_container(
            sa->containers[index], &sa->typecodes[index], copy_on_write);
        ra->containers[pos] = sa->containers[index];
        ra->typecodes[pos] = sa->typecodes[index];
    } else {
        ra->containers[pos] =
            container_clone(sa->containers[index], sa->typecodes[index]);
        ra->typecodes[pos] = sa->typecodes[index];
    }
    ra->size++;
}